

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_bool32 ma_dr_mp3_calculate_seek_points
                    (ma_dr_mp3 *pMP3,ma_uint32 *pSeekPointCount,ma_dr_mp3_seek_point *pSeekPoints)

{
  ma_uint64 frameIndex;
  ma_uint64 mVar1;
  ma_bool32 mVar2;
  ma_uint32 mVar3;
  ulong uVar4;
  ma_uint32 mVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ma_uint64 totalPCMFrameCount;
  ma_uint64 totalMP3FrameCount;
  ma_dr_mp3__seeking_mp3_frame_info mp3FrameInfo [3];
  float local_ac;
  ulong local_78;
  ulong local_70;
  ma_uint64 local_68;
  ulong uStack_60;
  ma_uint64 local_58;
  ulong uStack_50;
  ma_uint64 local_48;
  ulong uStack_40;
  
  if (pSeekPoints == (ma_dr_mp3_seek_point *)0x0 ||
      (pSeekPointCount == (ma_uint32 *)0x0 || pMP3 == (ma_dr_mp3 *)0x0)) {
    return 0;
  }
  uVar9 = (ulong)*pSeekPointCount;
  if (uVar9 == 0) {
    return 0;
  }
  frameIndex = pMP3->currentPCMFrame;
  mVar2 = ma_dr_mp3_get_mp3_and_pcm_frame_count(pMP3,&local_70,&local_78);
  if (mVar2 == 0) {
    return 0;
  }
  if (local_70 < 3) {
    pSeekPoints->seekPosInBytes = 0;
    pSeekPoints->pcmFrameIndex = 0;
    pSeekPoints->mp3FramesToDiscard = 0;
    pSeekPoints->pcmFramesToDiscard = 0;
    mVar5 = 1;
LAB_0015c080:
    *pSeekPointCount = mVar5;
    mVar2 = 1;
  }
  else {
    uVar6 = (ulong)((int)local_70 - 1);
    if (uVar9 <= local_70 - 1) {
      uVar6 = uVar9;
    }
    mVar5 = (ma_uint32)uVar6;
    mVar2 = (*pMP3->onSeek)(pMP3->pUserData,0,ma_dr_mp3_seek_origin_start);
    if (mVar2 != 0) {
      uVar9 = 0;
      pMP3->pcmFramesConsumedInMP3Frame = 0;
      pMP3->pcmFramesRemainingInMP3Frame = 0;
      pMP3->dataSize = 0;
      pMP3->currentPCMFrame = 0;
      pMP3->streamCursor = 0;
      pMP3->field_0x3ea0 = pMP3->field_0x3ea0 & 0xfe;
      (pMP3->decoder).header[0] = '\0';
      local_ac = 0.0;
      lVar7 = 8;
      do {
        *(ma_uint64 *)((long)&local_70 + lVar7) = pMP3->streamCursor - pMP3->dataSize;
        *(ulong *)((long)&local_68 + lVar7) = uVar9;
        mVar3 = ma_dr_mp3_decode_next_frame_ex(pMP3,(ma_dr_mp3d_sample_t *)0x0);
        if (mVar3 == 0) goto LAB_0015c302;
        local_ac = local_ac +
                   (float)(int)mVar3 / ((float)pMP3->mp3FrameSampleRate / (float)pMP3->sampleRate);
        uVar8 = (long)local_ac & 0xffffffff;
        local_ac = local_ac - (float)uVar8;
        uVar9 = uVar9 + uVar8;
        lVar7 = lVar7 + 0x10;
      } while (lVar7 != 0x38);
      if (mVar5 != 0) {
        uVar10 = 0;
        uVar8 = 0;
        do {
          uVar8 = uVar8 + local_78 / (mVar5 + 1);
          for (; uVar4 = uStack_50, mVar1 = local_58, uVar9 <= uVar8; uVar9 = uVar9 + uVar4) {
            local_58 = local_48;
            uStack_50 = uStack_40;
            local_68 = mVar1;
            uStack_60 = uVar4;
            local_48 = pMP3->streamCursor - pMP3->dataSize;
            uStack_40 = uVar9;
            mVar3 = ma_dr_mp3_decode_next_frame_ex(pMP3,(ma_dr_mp3d_sample_t *)0x0);
            if (mVar3 == 0) break;
            local_ac = local_ac +
                       (float)(int)mVar3 /
                       ((float)pMP3->mp3FrameSampleRate / (float)pMP3->sampleRate);
            uVar4 = (long)local_ac & 0xffffffff;
            local_ac = local_ac - (float)uVar4;
          }
          pSeekPoints[uVar10].seekPosInBytes = local_68;
          pSeekPoints[uVar10].pcmFrameIndex = uVar8;
          pSeekPoints[uVar10].mp3FramesToDiscard = 2;
          pSeekPoints[uVar10].pcmFramesToDiscard = (short)uVar8 - (short)uStack_50;
          uVar10 = uVar10 + 1;
        } while (uVar10 != uVar6);
      }
      mVar2 = (*pMP3->onSeek)(pMP3->pUserData,0,ma_dr_mp3_seek_origin_start);
      if (mVar2 != 0) {
        pMP3->pcmFramesConsumedInMP3Frame = 0;
        pMP3->pcmFramesRemainingInMP3Frame = 0;
        pMP3->dataSize = 0;
        pMP3->currentPCMFrame = 0;
        pMP3->streamCursor = 0;
        pMP3->field_0x3ea0 = pMP3->field_0x3ea0 & 0xfe;
        (pMP3->decoder).header[0] = '\0';
        mVar2 = ma_dr_mp3_seek_to_pcm_frame(pMP3,frameIndex);
        if (mVar2 == 0) {
          return 0;
        }
        goto LAB_0015c080;
      }
    }
LAB_0015c302:
    mVar2 = 0;
  }
  return mVar2;
}

Assistant:

MA_API ma_bool32 ma_dr_mp3_calculate_seek_points(ma_dr_mp3* pMP3, ma_uint32* pSeekPointCount, ma_dr_mp3_seek_point* pSeekPoints)
{
    ma_uint32 seekPointCount;
    ma_uint64 currentPCMFrame;
    ma_uint64 totalMP3FrameCount;
    ma_uint64 totalPCMFrameCount;
    if (pMP3 == NULL || pSeekPointCount == NULL || pSeekPoints == NULL) {
        return MA_FALSE;
    }
    seekPointCount = *pSeekPointCount;
    if (seekPointCount == 0) {
        return MA_FALSE;
    }
    currentPCMFrame = pMP3->currentPCMFrame;
    if (!ma_dr_mp3_get_mp3_and_pcm_frame_count(pMP3, &totalMP3FrameCount, &totalPCMFrameCount)) {
        return MA_FALSE;
    }
    if (totalMP3FrameCount < MA_DR_MP3_SEEK_LEADING_MP3_FRAMES+1) {
        seekPointCount = 1;
        pSeekPoints[0].seekPosInBytes     = 0;
        pSeekPoints[0].pcmFrameIndex      = 0;
        pSeekPoints[0].mp3FramesToDiscard = 0;
        pSeekPoints[0].pcmFramesToDiscard = 0;
    } else {
        ma_uint64 pcmFramesBetweenSeekPoints;
        ma_dr_mp3__seeking_mp3_frame_info mp3FrameInfo[MA_DR_MP3_SEEK_LEADING_MP3_FRAMES+1];
        ma_uint64 runningPCMFrameCount = 0;
        float runningPCMFrameCountFractionalPart = 0;
        ma_uint64 nextTargetPCMFrame;
        ma_uint32 iMP3Frame;
        ma_uint32 iSeekPoint;
        if (seekPointCount > totalMP3FrameCount-1) {
            seekPointCount = (ma_uint32)totalMP3FrameCount-1;
        }
        pcmFramesBetweenSeekPoints = totalPCMFrameCount / (seekPointCount+1);
        if (!ma_dr_mp3_seek_to_start_of_stream(pMP3)) {
            return MA_FALSE;
        }
        for (iMP3Frame = 0; iMP3Frame < MA_DR_MP3_SEEK_LEADING_MP3_FRAMES+1; ++iMP3Frame) {
            ma_uint32 pcmFramesInCurrentMP3FrameIn;
            MA_DR_MP3_ASSERT(pMP3->streamCursor >= pMP3->dataSize);
            mp3FrameInfo[iMP3Frame].bytePos       = pMP3->streamCursor - pMP3->dataSize;
            mp3FrameInfo[iMP3Frame].pcmFrameIndex = runningPCMFrameCount;
            pcmFramesInCurrentMP3FrameIn = ma_dr_mp3_decode_next_frame_ex(pMP3, NULL);
            if (pcmFramesInCurrentMP3FrameIn == 0) {
                return MA_FALSE;
            }
            ma_dr_mp3__accumulate_running_pcm_frame_count(pMP3, pcmFramesInCurrentMP3FrameIn, &runningPCMFrameCount, &runningPCMFrameCountFractionalPart);
        }
        nextTargetPCMFrame = 0;
        for (iSeekPoint = 0; iSeekPoint < seekPointCount; ++iSeekPoint) {
            nextTargetPCMFrame += pcmFramesBetweenSeekPoints;
            for (;;) {
                if (nextTargetPCMFrame < runningPCMFrameCount) {
                    pSeekPoints[iSeekPoint].seekPosInBytes     = mp3FrameInfo[0].bytePos;
                    pSeekPoints[iSeekPoint].pcmFrameIndex      = nextTargetPCMFrame;
                    pSeekPoints[iSeekPoint].mp3FramesToDiscard = MA_DR_MP3_SEEK_LEADING_MP3_FRAMES;
                    pSeekPoints[iSeekPoint].pcmFramesToDiscard = (ma_uint16)(nextTargetPCMFrame - mp3FrameInfo[MA_DR_MP3_SEEK_LEADING_MP3_FRAMES-1].pcmFrameIndex);
                    break;
                } else {
                    size_t i;
                    ma_uint32 pcmFramesInCurrentMP3FrameIn;
                    for (i = 0; i < MA_DR_MP3_COUNTOF(mp3FrameInfo)-1; ++i) {
                        mp3FrameInfo[i] = mp3FrameInfo[i+1];
                    }
                    mp3FrameInfo[MA_DR_MP3_COUNTOF(mp3FrameInfo)-1].bytePos       = pMP3->streamCursor - pMP3->dataSize;
                    mp3FrameInfo[MA_DR_MP3_COUNTOF(mp3FrameInfo)-1].pcmFrameIndex = runningPCMFrameCount;
                    pcmFramesInCurrentMP3FrameIn = ma_dr_mp3_decode_next_frame_ex(pMP3, NULL);
                    if (pcmFramesInCurrentMP3FrameIn == 0) {
                        pSeekPoints[iSeekPoint].seekPosInBytes     = mp3FrameInfo[0].bytePos;
                        pSeekPoints[iSeekPoint].pcmFrameIndex      = nextTargetPCMFrame;
                        pSeekPoints[iSeekPoint].mp3FramesToDiscard = MA_DR_MP3_SEEK_LEADING_MP3_FRAMES;
                        pSeekPoints[iSeekPoint].pcmFramesToDiscard = (ma_uint16)(nextTargetPCMFrame - mp3FrameInfo[MA_DR_MP3_SEEK_LEADING_MP3_FRAMES-1].pcmFrameIndex);
                        break;
                    }
                    ma_dr_mp3__accumulate_running_pcm_frame_count(pMP3, pcmFramesInCurrentMP3FrameIn, &runningPCMFrameCount, &runningPCMFrameCountFractionalPart);
                }
            }
        }
        if (!ma_dr_mp3_seek_to_start_of_stream(pMP3)) {
            return MA_FALSE;
        }
        if (!ma_dr_mp3_seek_to_pcm_frame(pMP3, currentPCMFrame)) {
            return MA_FALSE;
        }
    }
    *pSeekPointCount = seekPointCount;
    return MA_TRUE;
}